

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cc
# Opt level: O2

StringPiece re2::EngineName(Engine e)

{
  char *str;
  StringPiece SVar1;
  undefined1 local_1a0 [12];
  LogMessageFatal local_190;
  
  if ((int)e < 0) {
    LogMessageFatal::LogMessageFatal
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
               ,0x2c);
    std::operator<<((ostream *)&local_190.super_LogMessage.str_,"Check failed: (e) >= (0)");
  }
  else {
    if (e < kEngineMax) goto LAB_001224cf;
    LogMessageFatal::LogMessageFatal
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
               ,0x2d);
    std::operator<<((ostream *)&local_190.super_LogMessage.str_,
                    "Check failed: (e) < ((int)(sizeof(engine_names)/sizeof((engine_names)[0])))");
  }
  LogMessageFatal::~LogMessageFatal(&local_190);
LAB_001224cf:
  str = *(char **)(engine_names + (ulong)e * 8);
  if (str == (char *)0x0) {
    LogMessageFatal::LogMessageFatal
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
               ,0x2e);
    std::operator<<((ostream *)&local_190.super_LogMessage.str_,
                    "Check failed: engine_names[e] != NULL");
    LogMessageFatal::~LogMessageFatal(&local_190);
    str = *(char **)(engine_names + (ulong)e * 8);
  }
  StringPiece::StringPiece((StringPiece *)local_1a0,str);
  SVar1._12_4_ = 0;
  SVar1.ptr_ = (char *)local_1a0._0_8_;
  SVar1.length_ = local_1a0._8_4_;
  return SVar1;
}

Assistant:

static StringPiece EngineName(Engine e) {
  CHECK_GE(e, 0);
  CHECK_LT(e, arraysize(engine_names));
  CHECK(engine_names[e] != NULL);
  return engine_names[e];
}